

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Dam_ManCollectSets_rec(Dam_Man_t *p,int Id)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  int iLit;
  int iEnd;
  int iBeg;
  int i;
  Gia_Obj_t *pObj;
  int Id_local;
  Dam_Man_t *p_local;
  
  iVar2 = Dam_ObjHand(p,Id);
  if ((iVar2 == 0) && (Id != 0)) {
    pObj_00 = Gia_ManObj(p->pGia,Id);
    iVar2 = Gia_ObjIsCi(pObj_00);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsBuf(pObj_00);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsMux(p->pGia,pObj_00);
        if (iVar2 == 0) {
          Gia_ManSuperCollect(p->pGia,pObj_00,0);
          pVVar1 = p->vNod2Set;
          iVar2 = Vec_IntSize(p->vSetStore);
          Vec_IntWriteEntry(pVVar1,Id,iVar2);
          pVVar1 = p->vSetStore;
          iVar2 = Vec_IntSize(p->pGia->vSuper);
          Vec_IntPush(pVVar1,iVar2);
          iVar2 = Gia_ObjIsXor(pObj_00);
          iVar3 = Vec_IntSize(p->pGia->vSuper);
          p->nAnds = (iVar2 * 2 + 1) * (iVar3 + -1) + p->nAnds;
          iEnd = Vec_IntSize(p->vSetStore);
          Vec_IntAppend(p->vSetStore,p->pGia->vSuper);
          iVar2 = Vec_IntSize(p->vSetStore);
          for (; iEnd < iVar2; iEnd = iEnd + 1) {
            iVar3 = Vec_IntEntry(p->vSetStore,iEnd);
            iVar3 = Abc_Lit2Var(iVar3);
            Dam_ManCollectSets_rec(p,iVar3);
          }
        }
        else if ((*(ulong *)pObj_00 >> 0x1e & 1) == 0) {
          *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffbfffffff | 0x40000000;
          Vec_IntPush(p->vVisit,Id);
          iVar2 = Gia_ObjFaninId0(pObj_00,Id);
          Dam_ManCollectSets_rec(p,iVar2);
          iVar2 = Gia_ObjFaninId1(pObj_00,Id);
          Dam_ManCollectSets_rec(p,iVar2);
          iVar2 = Gia_ObjFaninId2(p->pGia,Id);
          Dam_ManCollectSets_rec(p,iVar2);
          p->nAnds = p->nAnds + 3;
        }
      }
      else {
        iVar2 = Gia_ObjFaninId0(pObj_00,Id);
        Dam_ManCollectSets_rec(p,iVar2);
      }
    }
  }
  return;
}

Assistant:

void Dam_ManCollectSets_rec( Dam_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    int i, iBeg, iEnd, iLit;
    if ( Dam_ObjHand(p, Id) || Id == 0 )
        return;
    pObj = Gia_ManObj(p->pGia, Id);
    if ( Gia_ObjIsCi(pObj) )
        return;
    if ( Gia_ObjIsBuf(pObj) )
    {
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId0(pObj, Id) );
        return;
    }
    if ( Gia_ObjIsMux(p->pGia, pObj) )
    {
        if ( pObj->fMark0 )
            return;
        pObj->fMark0 = 1;
        Vec_IntPush( p->vVisit, Id );
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId0(pObj, Id) );
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId1(pObj, Id) );
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId2(p->pGia, Id) );
        p->nAnds += 3;
        return;
    }
    Gia_ManSuperCollect( p->pGia, pObj, 0 );
    Vec_IntWriteEntry( p->vNod2Set, Id, Vec_IntSize(p->vSetStore) );
    Vec_IntPush( p->vSetStore, Vec_IntSize(p->pGia->vSuper) );
    p->nAnds += (1 + 2 * Gia_ObjIsXor(pObj)) * (Vec_IntSize(p->pGia->vSuper) - 1);
    // save entries
    iBeg = Vec_IntSize( p->vSetStore );
    Vec_IntAppend( p->vSetStore, p->pGia->vSuper );
    iEnd = Vec_IntSize( p->vSetStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vSetStore, iLit, i, iBeg, iEnd )
        Dam_ManCollectSets_rec( p, Abc_Lit2Var(iLit) );
}